

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerNewClassConstructor(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  DWORD DVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  AddrOpnd *opndArg;
  RegOpnd *pRVar10;
  IndirOpnd *pIVar11;
  RegOpnd *opndAuxSlots;
  Instr *instrNext;
  RegOpnd *opndConstructor;
  Opnd *opndCtorParent;
  RegOpnd *opndProto;
  AddrOpnd *opndFunctionBodySlot;
  RegOpnd *opndEnvironment;
  Instr *instrDef;
  RegOpnd *opndLink;
  Instr *instrPrev;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  pOVar6 = IR::Instr::UnlinkSrc1(instr);
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  pIVar2 = (pRVar7->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,25999,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(pIVar2);
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  pOVar6 = IR::Instr::GetSrc2(pIVar2);
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar6);
  pIVar2 = (pRVar9->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6594,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(pIVar2);
  opndArg = IR::Opnd::AsAddrOpnd(pOVar6);
  pOVar6 = IR::Instr::GetSrc2(pIVar2);
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar6);
  pIVar2 = (pRVar9->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6599,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(pIVar2);
  pRVar9 = IR::Opnd::AsRegOpnd(pOVar6);
  pOVar6 = IR::Instr::GetSrc2(pIVar2);
  pRVar10 = IR::Opnd::AsRegOpnd(pOVar6);
  pIVar2 = (pRVar10->m_sym->field_5).m_instrDef;
  if ((pIVar2 == (Instr *)0x0) || (pIVar2->m_opcode != ExtendArg_A)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x659e,"(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A)",
                       "instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  pOVar6 = IR::Instr::GetSrc1(pIVar2);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar6);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar9->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar7->super_Opnd);
  pOVar6 = IR::Instr::GetDst(instr);
  pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
  pIVar2 = instr->m_next;
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,HelperScrFunc_OP_NewClassConstructor,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  pRVar10 = IR::RegOpnd::New(TyUint64,this->m_func);
  DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
  pIVar11 = IR::IndirOpnd::New(pRVar9,DVar5,TyUint64,this->m_func,true);
  InsertMove(&pRVar10->super_Opnd,&pIVar11->super_Opnd,pIVar2,false);
  pIVar11 = IR::IndirOpnd::New(pRVar10,0,TyUint64,this->m_func,true);
  InsertMove(&pIVar11->super_Opnd,&pRVar7->super_Opnd,pIVar2,false);
  pRVar10 = IR::RegOpnd::New(TyUint64,this->m_func);
  DVar5 = Js::DynamicObject::GetOffsetOfAuxSlots();
  pIVar11 = IR::IndirOpnd::New(pRVar7,DVar5,TyUint64,this->m_func,true);
  InsertMove(&pRVar10->super_Opnd,&pIVar11->super_Opnd,pIVar2,false);
  pIVar11 = IR::IndirOpnd::New(pRVar10,0,TyUint64,this->m_func,true);
  InsertMove(&pIVar11->super_Opnd,&pRVar9->super_Opnd,pIVar2,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerNewClassConstructor(IR::Instr * instr)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::RegOpnd * opndLink = instr->UnlinkSrc1()->AsRegOpnd();
    IR::Instr * instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::RegOpnd * opndEnvironment = instrDef->GetSrc1()->AsRegOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::AddrOpnd * opndFunctionBodySlot = instrDef->GetSrc1()->AsAddrOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::RegOpnd * opndProto = instrDef->GetSrc1()->AsRegOpnd();
    opndLink = instrDef->GetSrc2()->AsRegOpnd();
    instrDef = opndLink->m_sym->m_instrDef;
    Assert(instrDef && instrDef->m_opcode == Js::OpCode::ExtendArg_A);

    IR::Opnd * opndCtorParent = instrDef->GetSrc1();

    m_lowererMD.LoadHelperArgument(instr, opndCtorParent);
    m_lowererMD.LoadHelperArgument(instr, opndProto);
    m_lowererMD.LoadHelperArgument(instr, opndFunctionBodySlot);
    m_lowererMD.LoadHelperArgument(instr, opndEnvironment);

    IR::RegOpnd * opndConstructor = instr->GetDst()->AsRegOpnd();
    IR::Instr * instrNext = instr->m_next;

    m_lowererMD.ChangeToHelperCall(instr, IR::HelperScrFunc_OP_NewClassConstructor);

    // Put constructor in proto's slot 0

    IR::RegOpnd * opndAuxSlots = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(opndAuxSlots, IR::IndirOpnd::New(opndProto, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func, true), instrNext, false);
    InsertMove(IR::IndirOpnd::New(opndAuxSlots, 0, TyMachPtr, m_func, true), opndConstructor, instrNext, false);

    // Put proto in constructor's slot 0

    opndAuxSlots = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(opndAuxSlots, IR::IndirOpnd::New(opndConstructor, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func, true), instrNext, false);
    InsertMove(IR::IndirOpnd::New(opndAuxSlots, 0, TyMachPtr, m_func, true), opndProto, instrNext, false);

    return instrPrev;
}